

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplaceRealloc<slang::Diagnostic_const&>
          (SmallVectorBase<slang::Diagnostic> *this,pointer pos,Diagnostic *args)

{
  pointer this_00;
  ulong uVar1;
  _Storage<unsigned_long,_true> _Var2;
  SourceLocation SVar3;
  undefined4 uVar4;
  bool bVar5;
  undefined7 uVar6;
  Diagnostic *__result;
  pointer __result_00;
  long lVar7;
  move_iterator<slang::Diagnostic_*> __last;
  move_iterator<slang::Diagnostic_*> __first;
  ulong uVar8;
  
  if (this->len == 0x124924924924924) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0x124924924924924 - uVar1 < uVar1) {
    uVar8 = 0x124924924924924;
  }
  lVar7 = (long)pos - (long)this->data_;
  __result = (Diagnostic *)operator_new(uVar8 * 0x70);
  this_00 = (pointer)((long)__result + lVar7);
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::vector((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            *)this_00,&args->args);
  std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
            ((vector<slang::SourceRange,_std::allocator<slang::SourceRange>_> *)
             ((long)__result + lVar7 + 0x18),&args->ranges);
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
            (&this_00->notes,&args->notes);
  this_00->symbol = args->symbol;
  _Var2 = (args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload;
  bVar5 = (args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged;
  uVar6 = *(undefined7 *)
           &(args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>.field_0x9;
  uVar4 = *(undefined4 *)&args->field_0x5c;
  SVar3 = args->location;
  this_00->code = args->code;
  *(undefined4 *)&this_00->field_0x5c = uVar4;
  this_00->location = SVar3;
  (this_00->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = _Var2;
  (this_00->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = bVar5;
  *(undefined7 *)
   &(this_00->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>.field_0x9 = uVar6;
  __first._M_current = this->data_;
  __last._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last._M_current != pos) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
              (__first,(move_iterator<slang::Diagnostic_*>)pos,__result);
    __last._M_current = this->data_ + this->len;
    __result_00 = this_00 + 1;
    __first._M_current = pos;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
            (__first,__last,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->len = this->len + 1;
  this->cap = uVar8;
  this->data_ = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}